

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

HRESULT __thiscall
Js::SourceTextModuleRecord::ResolveExternalModuleDependencies(SourceTextModuleRecord *this)

{
  Var pvVar1;
  ModuleNamespace *pMVar2;
  void *pvVar3;
  code *pcVar4;
  ModuleRecordBase *scriptContext;
  Type *pTVar5;
  SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  JavascriptString *pJVar10;
  undefined4 extraout_var;
  undefined4 *puVar12;
  Type *ppIVar13;
  undefined4 extraout_var_00;
  JavascriptError *pError;
  Iterator local_68;
  void *local_58;
  ModuleRecordBase *moduleRecordBase;
  Type *local_48;
  LPCOLESTR local_40;
  LPCOLESTR moduleName;
  char16_t *pcVar11;
  
  pvVar1 = (this->normalizedSpecifier).ptr;
  if (pvVar1 == (Var)0x0) {
    pcVar11 = L"module";
  }
  else {
    pJVar10 = VarTo<Js::JavascriptString>(pvVar1);
    iVar8 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar10);
    pcVar11 = (char16_t *)CONCAT44(extraout_var,iVar8);
  }
  iVar8 = 0;
  Output::TraceWithFlush(ModulePhase,L"ResolveExternalModuleDependencies(%s)\n",pcVar11);
  if ((this->requestedModuleList).ptr != (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    moduleRecordBase = (ModuleRecordBase *)(this->scriptContext).ptr;
    EnsureChildModuleSet(this,(ScriptContext *)moduleRecordBase);
    local_68.list =
         &((this->requestedModuleList).ptr)->
          super_SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>;
    local_68.current = &(local_68.list)->super_SListNodeBase<Memory::ArenaAllocator>;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    local_48 = &this->errorObject;
    iVar8 = 0;
    do {
      do {
        if ((SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_68.current ==
            (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar12 = 0;
        }
        local_68.current =
             (((SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)&(local_68.current)->next)->
             super_SListNodeBase<Memory::ArenaAllocator>).next;
        pSVar6 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
        if ((SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_68.current ==
            local_68.list) goto LAB_00b12409;
        ppIVar13 = SListBase<Ident_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_68);
        local_40 = (LPCOLESTR)&(*ppIVar13)->field_0x22;
        local_58 = (void *)0x0;
        moduleName = (LPCOLESTR)0x0;
        bVar7 = JsUtil::
                BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::TryGetValue<char16_t_const*>
                          ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                            *)(this->childrenModuleSet).ptr,&local_40,
                           (SourceTextModuleRecord **)&moduleName);
      } while (bVar7);
      pMVar2 = moduleRecordBase[0x79].namespaceObject.ptr;
      iVar8 = (*(pMVar2->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x12])
                        (pMVar2,this,local_40,&local_58);
      pSVar6 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_68.current;
      if (iVar8 < 0) break;
      moduleName = (LPCOLESTR)FromHost(local_58);
      pTVar5 = local_48;
      pvVar3 = (((SourceTextModuleRecord *)moduleName)->errorObject).ptr;
      if (pvVar3 == (void *)0x0) {
        pvVar1 = (((SourceTextModuleRecord *)moduleName)->normalizedSpecifier).ptr;
        pcVar11 = L"module";
        if (pvVar1 != (Var)0x0) {
          pJVar10 = VarTo<Js::JavascriptString>(pvVar1);
          iVar9 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar10);
          pcVar11 = (char16_t *)CONCAT44(extraout_var_00,iVar9);
        }
        Output::TraceWithFlush(ModulePhase,L"\t>SetParent in (%s)\n",pcVar11);
        SetParent((SourceTextModuleRecord *)moduleName,this,local_40);
      }
      else {
        Memory::Recycler::WBSetBit((char *)local_48);
        pTVar5->ptr = pvVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar5);
        iVar8 = -0x7fffbffb;
      }
      pSVar6 = (SList<Ident_*,_Memory::ArenaAllocator,_RealCount> *)local_68.current;
    } while (pvVar3 == (void *)0x0);
LAB_00b12409:
    local_68.current = (NodeBase *)pSVar6;
    pTVar5 = local_48;
    scriptContext = moduleRecordBase;
    if (iVar8 < 0) {
      if (local_48->ptr == (void *)0x0) {
        pError = JavascriptLibrary::CreateError
                           (*(JavascriptLibrary **)&moduleRecordBase->magicNumber);
        JavascriptError::SetErrorMessageProperties
                  (pError,iVar8,L"fetch import module failed",(ScriptContext *)scriptContext);
        Memory::Recycler::WBSetBit((char *)pTVar5);
        pTVar5->ptr = pError;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar5);
      }
      Output::TraceWithFlush(ModulePhase,L"\tfetch import module failed\n");
      NotifyParentsAsNeeded(this);
    }
  }
  return iVar8;
}

Assistant:

HRESULT SourceTextModuleRecord::ResolveExternalModuleDependencies()
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("ResolveExternalModuleDependencies(%s)\n"), this->GetSpecifierSz());

        ScriptContext* scriptContext = GetScriptContext();

        HRESULT hr = NOERROR;
        if (requestedModuleList != nullptr)
        {
            EnsureChildModuleSet(scriptContext);

            requestedModuleList->MapUntil([&](IdentPtr specifier) {
                LPCOLESTR moduleName = specifier->Psz();
                ModuleRecordBase* moduleRecordBase = nullptr;
                SourceTextModuleRecord* moduleRecord = nullptr;
                bool itemFound = childrenModuleSet->TryGetValue(moduleName, &moduleRecord);
                if (!itemFound)
                {
                    hr = scriptContext->GetHostScriptContext()->FetchImportedModule(this, moduleName, &moduleRecordBase);
                    if (FAILED(hr))
                    {
                        return true;
                    }
                    moduleRecord = SourceTextModuleRecord::FromHost(moduleRecordBase);
                    Var errorObject = moduleRecord->GetErrorObject();
                    if (errorObject == nullptr)
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>SetParent in (%s)\n"), moduleRecord->GetSpecifierSz());
                        moduleRecord->SetParent(this, moduleName);
                    }
                    else
                    {
                        this->errorObject = errorObject;
                        hr = E_FAIL;
                        return true;
                    }
                }
                return false;
            });

            if (FAILED(hr))
            {
                if (this->errorObject == nullptr)
                {
                    JavascriptError *error = scriptContext->GetLibrary()->CreateError();
                    JavascriptError::SetErrorMessageProperties(error, hr, _u("fetch import module failed"), scriptContext);
                    this->errorObject = error;
                }

                OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\tfetch import module failed\n"));
                NotifyParentsAsNeeded();
            }
        }
        return hr;
    }